

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O0

long __thiscall
booster::locale::impl_icu::icu_std_converter<char,1>::uconv::go_abi_cxx11_(void *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  int n;
  UErrorCode err;
  char *ptr;
  string_type *res;
  undefined4 local_44;
  undefined8 local_40;
  undefined1 local_21;
  undefined4 local_1c;
  undefined8 local_18;
  void *local_8;
  
  local_21 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::resize((ulong)this);
  uVar3 = std::__cxx11::string::operator[]((ulong)this);
  local_44 = 0;
  uVar1 = *in_RSI;
  local_40 = uVar3;
  uVar2 = std::__cxx11::string::size();
  ucnv_fromUChars_70(uVar1,uVar3,uVar2,local_18,local_1c,&local_44);
  check_and_throw_icu_error(U_ZERO_ERROR);
  std::__cxx11::string::resize((ulong)this);
  return (long)this;
}

Assistant:

string_type go(UChar const *buf,int length,int max_size)
            {
                string_type res;
                res.resize(UCNV_GET_MAX_BYTES_FOR_STRING(length,max_size));
                char *ptr=reinterpret_cast<char *>(&res[0]);
                UErrorCode err=U_ZERO_ERROR;
                int n = ucnv_fromUChars(cvt_,ptr,res.size(),buf,length,&err);
                check_and_throw_icu_error(err);
                res.resize(n);
                return res;
            }